

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_helpers.cpp
# Opt level: O0

int RaiseFileDescriptorLimit(int nMinFD)

{
  int iVar1;
  int in_EDI;
  long in_FS_OFFSET;
  rlimit limitFD;
  int local_1c;
  rlimit local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = getrlimit(RLIMIT_NOFILE,&local_18);
  local_1c = in_EDI;
  if (iVar1 != -1) {
    if (local_18.rlim_cur < (ulong)(long)in_EDI) {
      local_18.rlim_cur = (rlim_t)in_EDI;
      if (local_18.rlim_max < local_18.rlim_cur) {
        local_18.rlim_cur = local_18.rlim_max;
      }
      setrlimit(RLIMIT_NOFILE,&local_18);
      getrlimit(RLIMIT_NOFILE,&local_18);
    }
    local_1c = (int)local_18.rlim_cur;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_1c;
}

Assistant:

int RaiseFileDescriptorLimit(int nMinFD)
{
#if defined(WIN32)
    return 2048;
#else
    struct rlimit limitFD;
    if (getrlimit(RLIMIT_NOFILE, &limitFD) != -1) {
        if (limitFD.rlim_cur < (rlim_t)nMinFD) {
            limitFD.rlim_cur = nMinFD;
            if (limitFD.rlim_cur > limitFD.rlim_max)
                limitFD.rlim_cur = limitFD.rlim_max;
            setrlimit(RLIMIT_NOFILE, &limitFD);
            getrlimit(RLIMIT_NOFILE, &limitFD);
        }
        return limitFD.rlim_cur;
    }
    return nMinFD; // getrlimit failed, assume it's fine
#endif
}